

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_encoding.c
# Opt level: O0

int hdr_base64_encode(uint8_t *input,size_t input_len,char *output,size_t output_len)

{
  size_t sVar1;
  size_t remaining;
  size_t j;
  size_t i;
  size_t output_len_local;
  char *output_local;
  size_t input_len_local;
  uint8_t *input_local;
  
  sVar1 = hdr_base64_encoded_len(input_len);
  if (sVar1 == output_len) {
    remaining = 0;
    for (j = 0; 2 < input_len - j && remaining < output_len; j = j + 3) {
      hdr_base64_encode_block(input + j,output + remaining);
      remaining = remaining + 4;
    }
    hdr_base64_encode_block_pad(input + j,output + remaining,input_len - j);
    input_local._4_4_ = 0;
  }
  else {
    input_local._4_4_ = 0x16;
  }
  return input_local._4_4_;
}

Assistant:

int hdr_base64_encode(
    const uint8_t* input, size_t input_len, char* output, size_t output_len)
{
    size_t i, j, remaining;

    if (hdr_base64_encoded_len(input_len) != output_len)
    {
        return EINVAL;
    }

    for (i = 0, j = 0; input_len - i >= 3 && j < output_len; i += 3, j += 4)
    {
        hdr_base64_encode_block(&input[i], &output[j]);
    }

    remaining = input_len - i;

    hdr_base64_encode_block_pad(&input[i], &output[j], remaining);

    return 0;
}